

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  cmValue v;
  cmGlobalGhsMultiGenerator *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = this;
  WriteFileHeader(this,fout);
  WriteMacros(this_00,fout,root);
  WriteHighLevelDirectives(this,fout,root);
  GhsMultiGpj::WriteGpjTag(PROJECT,fout);
  std::operator<<(fout,"# Top Level Project File\n");
  pcVar1 = root->Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"GHS_BSP_NAME",&local_39);
  psVar3 = (string *)cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = cmIsOff((cmValue)0x36d85a);
  if (!bVar2) {
    poVar4 = std::operator<<(fout,"    -bsp ");
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4,'\n');
  }
  pcVar1 = root->Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"GHS_OS_DIR",&local_39);
  v = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = cmIsOff((cmValue)0x36d8cb);
  if (!bVar2) {
    pcVar1 = root->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GHS_OS_DIR_OPTION",&local_39);
    psVar3 = (string *)cmMakefile::GetDefinition(pcVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::operator<<(fout,"    ");
    bVar2 = cmIsOff((cmValue)0x36d91e);
    if (bVar2) {
      std::operator<<(fout,"");
    }
    else {
      if (psVar3 == (string *)0x0) {
        psVar3 = &cmValue::Empty_abi_cxx11_;
      }
      std::operator<<(fout,(string *)psVar3);
    }
    poVar4 = std::operator<<(fout,"\"");
    poVar4 = ::operator<<(poVar4,v);
    std::operator<<(poVar4,"\"\n");
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(fout, root);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File\n";

  // Specify BSP option if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue bspName = root->GetMakefile()->GetDefinition("GHS_BSP_NAME");
  if (!cmIsOff(bspName)) {
    fout << "    -bsp " << *bspName << '\n';
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue osDir = root->GetMakefile()->GetDefinition("GHS_OS_DIR");
  if (!cmIsOff(osDir)) {
    cmValue osDirOption =
      root->GetMakefile()->GetDefinition("GHS_OS_DIR_OPTION");
    fout << "    ";
    if (cmIsOff(osDirOption)) {
      fout << "";
    } else {
      fout << *osDirOption;
    }
    fout << "\"" << osDir << "\"\n";
  }
}